

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.h
# Opt level: O2

void COutPoint::
     SerializationOps<ParamsStream<HashWriter&,TransactionSerParams>,COutPoint_const,ActionSerialize>
               (transaction_identifier<false> *obj,
               ParamsStream<HashWriter_&,_TransactionSerParams> *s)

{
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    SerializeMany<ParamsStream<HashWriter&,TransactionSerParams>,transaction_identifier<false>,unsigned_int>
              (s,obj,(uint *)(obj + 1));
    return;
  }
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(COutPoint, obj) { READWRITE(obj.hash, obj.n); }